

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_simple.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,AlterStatement *stmt)

{
  _func_int ***ppp_Var1;
  bool bVar2;
  int iVar3;
  pointer pAVar4;
  pointer pAVar5;
  SetColumnCommentInfo *this_00;
  pointer pAVar6;
  StatementProperties *this_01;
  undefined4 extraout_var;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> this_03;
  BinderException *this_04;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> _Var7;
  unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true> *this_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  EntryLookupInfo lookup_info;
  allocator_type local_c9;
  undefined1 local_c8 [8];
  CatalogEntry *pCStack_c0;
  string *local_b8;
  pointer pbStack_b0;
  CatalogEntry *local_a8;
  element_type *peStack_a0;
  pointer local_98;
  optional_ptr<duckdb::CatalogEntry,_true> local_88;
  pointer pbStack_80;
  pointer local_78;
  _Head_base<0UL,_duckdb::AlterInfo_*,_false> local_70;
  _Alloc_hider local_68;
  string *psStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  LogicalType local_48;
  Catalog *this_02;
  
  local_a8 = (CatalogEntry *)0x0;
  peStack_a0 = (element_type *)0x0;
  local_b8 = (string *)0x0;
  pbStack_b0 = (pointer)0x0;
  local_c8 = (undefined1  [8])0x0;
  pCStack_c0 = (CatalogEntry *)0x0;
  local_98 = (pointer)0x0;
  local_68._M_p = (pointer)&local_58;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"Success","");
  __l._M_len = 1;
  __l._M_array = (iterator)&local_68;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_48,__l,&local_c9);
  local_78 = local_98;
  pbStack_80 = (pointer)peStack_a0;
  local_88.ptr = local_a8;
  local_98 = (pointer)local_48.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
  local_a8 = (CatalogEntry *)local_48._0_8_;
  peStack_a0 = local_48.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.id_ = INVALID;
  local_48.physical_type_ = ~INVALID;
  local_48._2_6_ = 0;
  local_48.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_48.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p);
  }
  LogicalType::LogicalType(&local_48,BOOLEAN);
  __l_00._M_len = 1;
  __l_00._M_array = &local_48;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88,__l_00,
             (allocator_type *)&local_c9);
  local_58._M_allocated_capacity = (size_type)pbStack_b0;
  psStack_60 = local_b8;
  local_68._M_p = (pointer)pCStack_c0;
  pbStack_b0 = local_78;
  pCStack_c0 = local_88.ptr;
  local_b8 = pbStack_80;
  local_88.ptr = (CatalogEntry *)0x0;
  pbStack_80 = (pointer)0x0;
  local_78 = (pointer)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_68);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_88);
  LogicalType::~LogicalType(&local_48);
  this_05 = &stmt->info;
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     (this_05);
  pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     (this_05);
  BindSchemaOrCatalog(this->context,&pAVar4->catalog,&pAVar5->schema);
  local_88.ptr = (CatalogEntry *)0x0;
  pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                     (this_05);
  if ((pAVar4->super_ParseInfo).field_0x9 == '\b') {
    this_00 = (SetColumnCommentInfo *)
              unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::
              operator->(this_05);
    local_88 = SetColumnCommentInfo::TryResolveCatalogEntry(this_00,&this->entry_retriever);
  }
  else {
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    iVar3 = (*(pAVar4->super_ParseInfo)._vptr_ParseInfo[3])(pAVar4);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    EntryLookupInfo::EntryLookupInfo
              ((EntryLookupInfo *)&local_68,(CatalogType)iVar3,&pAVar4->name,
               (QueryErrorContext)0xffffffffffffffff);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    pAVar5 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    pAVar6 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    local_88 = CatalogEntryRetriever::GetEntry
                         (&this->entry_retriever,&pAVar4->catalog,&pAVar5->schema,
                          (EntryLookupInfo *)&local_68,(pAVar6->super_ParseInfo).field_0xa);
  }
  this_01 = GetStatementProperties(this);
  this_01->return_type = NOTHING;
  if (local_88.ptr == (CatalogEntry *)0x0) {
    this_03._M_head_impl = (LogicalOperator *)operator_new(0x70);
    _Var7._M_head_impl =
         (this_05->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
         super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
    (this_05->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
    super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)0x0;
    LogicalOperator::LogicalOperator(this_03._M_head_impl,LOGICAL_ALTER);
  }
  else {
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_88);
    iVar3 = (*(local_88.ptr)->_vptr_CatalogEntry[0xb])();
    this_02 = (Catalog *)CONCAT44(extraout_var,iVar3);
    bVar2 = Catalog::IsSystemCatalog(this_02);
    if (bVar2) {
      this_04 = (BinderException *)__cxa_allocate_exception(0x10);
      local_68._M_p = (pointer)&local_58;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_68,"Can not comment on System Catalog entries","");
      BinderException::BinderException(this_04,(string *)&local_68);
      __cxa_throw(this_04,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_88);
    if ((local_88.ptr)->temporary == false) {
      StatementProperties::RegisterDBModify(this_01,this_02,this->context);
    }
    Catalog::GetName_abi_cxx11_(this_02);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    ::std::__cxx11::string::_M_assign((string *)&pAVar4->catalog);
    optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_88);
    (*(local_88.ptr)->_vptr_CatalogEntry[0xd])();
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    ::std::__cxx11::string::_M_assign((string *)&pAVar4->schema);
    pAVar4 = unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>::operator->
                       (this_05);
    bVar2 = AlterInfo::IsAddPrimaryKey(pAVar4);
    if (bVar2) {
      optional_ptr<duckdb::CatalogEntry,_true>::CheckValid(&local_88);
      local_70._M_head_impl =
           (this_05->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>).
           _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>.
           _M_t.super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>
           .super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
      (this_05->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)._M_t.
      super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
      super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)0x0;
      BindAlterAddIndex(__return_storage_ptr__,this,(BoundStatement *)local_c8,local_88.ptr,
                        (unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>,_true>
                         *)&local_70);
      if (local_70._M_head_impl != (AlterInfo *)0x0) {
        (*((local_70._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
      local_70._M_head_impl = (AlterInfo *)0x0;
      goto LAB_006f015c;
    }
    this_03._M_head_impl = (LogicalOperator *)operator_new(0x70);
    _Var7._M_head_impl =
         (this_05->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t
         .super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
         super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl;
    (this_05->super_unique_ptr<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::AlterInfo,_std::default_delete<duckdb::AlterInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::AlterInfo_*,_std::default_delete<duckdb::AlterInfo>_>.
    super__Head_base<0UL,_duckdb::AlterInfo_*,_false>._M_head_impl = (AlterInfo *)0x0;
    LogicalOperator::LogicalOperator(this_03._M_head_impl,LOGICAL_ALTER);
  }
  (this_03._M_head_impl)->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalSimple_0197c540;
  this_03._M_head_impl[1]._vptr_LogicalOperator = (_func_int **)_Var7._M_head_impl;
  if ((_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_c8 !=
      (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
    ppp_Var1 = (_func_int ***)local_c8;
    local_c8 = (undefined1  [8])this_03._M_head_impl;
    (*(*ppp_Var1)[1])();
    this_03._M_head_impl = (LogicalOperator *)local_c8;
  }
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)this_03._M_head_impl;
  local_c8 = (undefined1  [8])0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pCStack_c0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pbStack_b0;
  pbStack_b0 = (pointer)0x0;
  pCStack_c0 = (CatalogEntry *)0x0;
  local_b8 = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_a8;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)peStack_a0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_98;
  local_98 = (pointer)0x0;
  local_a8 = (CatalogEntry *)0x0;
  peStack_a0 = (element_type *)0x0;
LAB_006f015c:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&pCStack_c0);
  if ((tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)local_c8 !=
      (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0) {
    (**(code **)(*(long *)local_c8 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::Bind(AlterStatement &stmt) {
	BoundStatement result;
	result.names = {"Success"};
	result.types = {LogicalType::BOOLEAN};
	BindSchemaOrCatalog(stmt.info->catalog, stmt.info->schema);

	optional_ptr<CatalogEntry> entry;
	if (stmt.info->type == AlterType::SET_COLUMN_COMMENT) {
		// Extra step for column comments: They can alter a table or a view, and we resolve that here.
		auto &info = stmt.info->Cast<SetColumnCommentInfo>();
		entry = info.TryResolveCatalogEntry(entry_retriever);

	} else {
		// For any other ALTER, we retrieve the catalog entry directly.
		EntryLookupInfo lookup_info(stmt.info->GetCatalogType(), stmt.info->name);
		entry = entry_retriever.GetEntry(stmt.info->catalog, stmt.info->schema, lookup_info, stmt.info->if_not_found);
	}

	auto &properties = GetStatementProperties();
	properties.return_type = StatementReturnType::NOTHING;
	if (!entry) {
		result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_ALTER, std::move(stmt.info));
		return result;
	}

	D_ASSERT(!entry->deleted);
	auto &catalog = entry->ParentCatalog();
	if (catalog.IsSystemCatalog()) {
		throw BinderException("Can not comment on System Catalog entries");
	}
	if (!entry->temporary) {
		// We can only alter temporary tables and views in read-only mode.
		properties.RegisterDBModify(catalog, context);
	}
	stmt.info->catalog = catalog.GetName();
	stmt.info->schema = entry->ParentSchema().name;

	if (!stmt.info->IsAddPrimaryKey()) {
		result.plan = make_uniq<LogicalSimple>(LogicalOperatorType::LOGICAL_ALTER, std::move(stmt.info));
		return result;
	}

	return BindAlterAddIndex(result, *entry, std::move(stmt.info));
}